

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O2

void Abc_SclWriteScl(char *pFileName,SC_Lib *p)

{
  int iVar1;
  Vec_Str_t *vOut;
  undefined8 *puVar2;
  char *pcVar3;
  void *pvVar4;
  undefined8 *puVar5;
  word wVar6;
  undefined8 *puVar7;
  FILE *__s;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  
  vOut = Vec_StrAlloc(10000);
  Vec_StrPutI(vOut,8);
  Vec_StrPutS(vOut,p->pName);
  Vec_StrPutS(vOut,p->default_wire_load);
  Vec_StrPutS(vOut,p->default_wire_load_sel);
  Vec_StrPutF(vOut,p->default_max_out_slew);
  if (p->unit_time < 0) {
    __assert_fail("p->unit_time >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                  ,0x167,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
  }
  if (p->unit_cap_snd < 0) {
    __assert_fail("p->unit_cap_snd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                  ,0x168,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
  }
  Vec_StrPutI(vOut,p->unit_time);
  Vec_StrPutF(vOut,p->unit_cap_fst);
  Vec_StrPutI(vOut,p->unit_cap_snd);
  Vec_StrPutI(vOut,(p->vWireLoads).nSize);
  for (iVar8 = 0; iVar8 < (p->vWireLoads).nSize; iVar8 = iVar8 + 1) {
    puVar2 = (undefined8 *)Vec_PtrEntry(&p->vWireLoads,iVar8);
    Vec_StrPutS(vOut,(char *)*puVar2);
    Vec_StrPutF(vOut,*(float *)(puVar2 + 1));
    Vec_StrPutF(vOut,*(float *)((long)puVar2 + 0xc));
    Vec_StrPutI(vOut,*(int *)((long)puVar2 + 0x14));
    for (iVar11 = 0; iVar11 < *(int *)((long)puVar2 + 0x14); iVar11 = iVar11 + 1) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)(puVar2 + 2),iVar11);
      Vec_StrPutI(vOut,iVar1);
      fVar12 = Vec_FltEntry((Vec_Flt_t *)(puVar2 + 4),iVar11);
      Vec_StrPutF(vOut,fVar12);
    }
  }
  Vec_StrPutI(vOut,(p->vWireLoadSels).nSize);
  for (iVar8 = 0; iVar8 < (p->vWireLoadSels).nSize; iVar8 = iVar8 + 1) {
    puVar2 = (undefined8 *)Vec_PtrEntry(&p->vWireLoadSels,iVar8);
    Vec_StrPutS(vOut,(char *)*puVar2);
    Vec_StrPutI(vOut,*(int *)((long)puVar2 + 0xc));
    for (iVar11 = 0; iVar11 < *(int *)((long)puVar2 + 0xc); iVar11 = iVar11 + 1) {
      fVar12 = Vec_FltEntry((Vec_Flt_t *)(puVar2 + 1),iVar11);
      Vec_StrPutF(vOut,fVar12);
      fVar12 = Vec_FltEntry((Vec_Flt_t *)(puVar2 + 3),iVar11);
      Vec_StrPutF(vOut,fVar12);
      pcVar3 = (char *)Vec_PtrEntry((Vec_Ptr_t *)(puVar2 + 5),iVar11);
      Vec_StrPutS(vOut,pcVar3);
    }
  }
  iVar8 = 0;
  for (iVar11 = 0; iVar11 < (p->vCells).nSize; iVar11 = iVar11 + 1) {
    pvVar4 = Vec_PtrEntry(&p->vCells,iVar11);
    if (*(int *)((long)pvVar4 + 0x10) == 0) {
      iVar8 = iVar8 + (uint)(*(int *)((long)pvVar4 + 0x14) == 0);
    }
  }
  Vec_StrPutI(vOut,iVar8);
  iVar8 = 0;
  do {
    if ((p->vCells).nSize <= iVar8) {
      iVar8 = vOut->nSize;
      if (0 < (long)iVar8) {
        __s = fopen(pFileName,"wb");
        if (__s == (FILE *)0x0) {
          printf("Cannot open file \"%s\" for writing.\n",pFileName);
        }
        else {
          fwrite(vOut->pArray,1,(long)iVar8,__s);
          fclose(__s);
        }
      }
      Vec_StrFree(vOut);
      return;
    }
    puVar2 = (undefined8 *)Vec_PtrEntry(&p->vCells,iVar8);
    if ((*(int *)(puVar2 + 2) == 0) && (*(int *)((long)puVar2 + 0x14) == 0)) {
      Vec_StrPutS(vOut,(char *)*puVar2);
      Vec_StrPutF(vOut,*(float *)(puVar2 + 3));
      Vec_StrPutF(vOut,*(float *)((long)puVar2 + 0x1c));
      Vec_StrPutI(vOut,*(int *)(puVar2 + 5));
      Vec_StrPutI(vOut,*(int *)(puVar2 + 8));
      Vec_StrPutI(vOut,*(int *)((long)puVar2 + 0x44));
      for (iVar11 = 0; iVar1 = *(int *)(puVar2 + 8), iVar11 < iVar1; iVar11 = iVar11 + 1) {
        puVar5 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar2 + 6),iVar11);
        if (*(int *)(puVar5 + 1) != 1) {
          __assert_fail("pPin->dir == sc_dir_Input",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                        ,0x1a2,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
        }
        Vec_StrPutS(vOut,(char *)*puVar5);
        Vec_StrPutF(vOut,*(float *)(puVar5 + 2));
        Vec_StrPutF(vOut,*(float *)((long)puVar5 + 0x14));
      }
      for (; iVar1 < *(int *)((long)puVar2 + 0x34); iVar1 = iVar1 + 1) {
        puVar5 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar2 + 6),iVar1);
        if (*(int *)(puVar5 + 1) != 2) {
          __assert_fail("pPin->dir == sc_dir_Output",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                        ,0x1ad,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
        }
        Vec_StrPutS(vOut,(char *)*puVar5);
        Vec_StrPutF(vOut,*(float *)(puVar5 + 4));
        Vec_StrPutF(vOut,*(float *)((long)puVar5 + 0x24));
        Vec_StrPutI(vOut,*(int *)(puVar2 + 8));
        pcVar3 = (char *)puVar5[5];
        if (pcVar3 == (char *)0x0) {
          pcVar3 = "";
        }
        Vec_StrPutS(vOut,pcVar3);
        iVar11 = *(int *)((long)puVar5 + 0x34);
        iVar10 = 1 << ((char)*(int *)(puVar2 + 8) - 6U & 0x1f);
        if (*(int *)(puVar2 + 8) < 7) {
          iVar10 = 1;
        }
        if (iVar11 != iVar10) {
          __assert_fail("Vec_WrdSize(&pPin->vFunc) == Abc_Truth6WordNum(pCell->n_inputs)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                        ,0x1b7,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
        }
        for (iVar10 = 0; iVar10 < iVar11; iVar10 = iVar10 + 1) {
          wVar6 = Vec_WrdEntry((Vec_Wrd_t *)(puVar5 + 6),iVar10);
          for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 8) {
            Vec_StrPush(vOut,(char)(wVar6 >> ((byte)lVar9 & 0x3f)));
          }
          iVar11 = *(int *)((long)puVar5 + 0x34);
        }
        iVar11 = *(int *)((long)puVar5 + 0x44);
        if (iVar11 != *(int *)(puVar2 + 8)) {
          __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                        ,0x1bc,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
        }
        for (iVar10 = 0; iVar10 < iVar11; iVar10 = iVar10 + 1) {
          puVar7 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar5 + 8),iVar10);
          Vec_StrPutS(vOut,(char *)*puVar7);
          Vec_StrPutI(vOut,*(int *)((long)puVar7 + 0xc));
          if (*(int *)((long)puVar7 + 0xc) != 0) {
            if (*(int *)((long)puVar7 + 0xc) != 1) {
              __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                            ,0x1d0,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
            }
            pvVar4 = Vec_PtrEntry((Vec_Ptr_t *)(puVar7 + 1),0);
            Vec_StrPutI(vOut,*(int *)((long)pvVar4 + 8));
            Abc_SclWriteSurface(vOut,(SC_Surface *)((long)pvVar4 + 0x18));
            Abc_SclWriteSurface(vOut,(SC_Surface *)((long)pvVar4 + 200));
            Abc_SclWriteSurface(vOut,(SC_Surface *)((long)pvVar4 + 0x178));
            Abc_SclWriteSurface(vOut,(SC_Surface *)((long)pvVar4 + 0x228));
          }
          iVar11 = *(int *)((long)puVar5 + 0x44);
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void Abc_SclWriteScl( char * pFileName, SC_Lib * p )
{
    Vec_Str_t * vOut;
    vOut = Vec_StrAlloc( 10000 );
    Abc_SclWriteLibrary( vOut, p );
    if ( Vec_StrSize(vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(vOut), 1, Vec_StrSize(vOut), pFile );
            fclose( pFile );
        }
    }
    Vec_StrFree( vOut );    
}